

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O1

bool __thiscall
metal::scatter(metal *this,ray *r_in,hit_record *rec,vec3 *attenuation,ray *scattered)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  dVar1 = (r_in->dir).e[0];
  dVar2 = (r_in->dir).e[1];
  dVar3 = (r_in->dir).e[2];
  dVar15 = dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2;
  if (dVar15 < 0.0) {
    dVar15 = sqrt(dVar15);
  }
  else {
    dVar15 = SQRT(dVar15);
  }
  dVar4 = (rec->normal).e[0];
  dVar5 = (rec->normal).e[1];
  dVar6 = (rec->normal).e[2];
  dVar7 = this->fuzz;
  do {
    iVar13 = rand();
    dVar14 = (double)iVar13 * 4.656612873077393e-10 + (double)iVar13 * 4.656612873077393e-10 + -1.0;
    iVar13 = rand();
    dVar9 = (double)iVar13 * 4.656612873077393e-10 + (double)iVar13 * 4.656612873077393e-10 + -1.0;
    iVar13 = rand();
    dVar10 = (double)iVar13 * 4.656612873077393e-10 + (double)iVar13 * 4.656612873077393e-10 + -1.0;
  } while (1.0 <= dVar10 * dVar10 + dVar14 * dVar14 + dVar9 * dVar9);
  dVar15 = 1.0 / dVar15;
  dVar16 = dVar3 * dVar15 * dVar6 + dVar1 * dVar15 * dVar4 + dVar2 * dVar15 * dVar5;
  dVar16 = dVar16 + dVar16;
  dVar8 = r_in->tm;
  dVar11 = (rec->p).e[0];
  dVar12 = (rec->p).e[1];
  (scattered->orig).e[2] = (rec->p).e[2];
  (scattered->orig).e[0] = dVar11;
  (scattered->orig).e[1] = dVar12;
  (scattered->dir).e[0] = dVar14 * dVar7 + (dVar1 * dVar15 - dVar16 * dVar4);
  (scattered->dir).e[1] = dVar9 * dVar7 + (dVar2 * dVar15 - dVar5 * dVar16);
  (scattered->dir).e[2] = dVar10 * dVar7 + (dVar3 * dVar15 - dVar6 * dVar16);
  scattered->tm = dVar8;
  attenuation->e[2] = (this->albedo).e[2];
  dVar1 = (this->albedo).e[1];
  attenuation->e[0] = (this->albedo).e[0];
  attenuation->e[1] = dVar1;
  return 0.0 < (scattered->dir).e[2] * (rec->normal).e[2] +
               (scattered->dir).e[0] * (rec->normal).e[0] +
               (scattered->dir).e[1] * (rec->normal).e[1];
}

Assistant:

virtual bool scatter(
            const ray& r_in, const hit_record& rec, vec3& attenuation, ray& scattered
    ) const {
        vec3 reflected = reflect(unit_vector(r_in.direction()), rec.normal);
        scattered = ray(rec.p, reflected + fuzz * random_in_sphere(), r_in.time());
        attenuation = albedo;
        return (dot(scattered.direction(), rec.normal) > 0);
    }